

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_lz4.c
# Opt level: O3

int archive_filter_lz4_options(archive_write_filter *f,char *key,char *value)

{
  byte bVar1;
  int *piVar2;
  short sVar3;
  ushort uVar4;
  int iVar5;
  ushort uVar6;
  
  piVar2 = (int *)f->data;
  iVar5 = strcmp(key,"compression-level");
  if (iVar5 == 0) {
    if (value == (char *)0x0) {
      return -0x14;
    }
    bVar1 = *value;
    if (8 < (byte)(bVar1 - 0x31)) {
      return -0x14;
    }
    if (value[1] != '\0') {
      return -0x14;
    }
    if (bVar1 < 0x33) {
      *piVar2 = (char)bVar1 + -0x30;
      return 0;
    }
    archive_set_error(f->archive,0x16,"High compression not included in this build");
    return -0x1e;
  }
  iVar5 = strcmp(key,"stream-checksum");
  if (iVar5 == 0) {
    uVar4 = (ushort)(value != (char *)0x0) << 5;
    uVar6 = (ushort)piVar2[1] & 0xffdf;
LAB_0016079c:
    *(ushort *)(piVar2 + 1) = uVar6 | uVar4;
  }
  else {
    iVar5 = strcmp(key,"block-checksum");
    if (iVar5 == 0) {
      sVar3 = ((ushort)piVar2[1] & 0xfff7) + (ushort)(value != (char *)0x0) * 8;
    }
    else {
      iVar5 = strcmp(key,"block-size");
      if (iVar5 == 0) {
        if (value == (char *)0x0) {
          return -0x14;
        }
        if ((*value & 0xfcU) != 0x34) {
          return -0x14;
        }
        if (value[1] != '\0') {
          return -0x14;
        }
        uVar6 = (ushort)piVar2[1] & 0xfc7f;
        uVar4 = ((byte)*value & 7) << 7;
        goto LAB_0016079c;
      }
      iVar5 = strcmp(key,"block-dependence");
      if (iVar5 != 0) {
        return -0x14;
      }
      sVar3 = ((ushort)piVar2[1] & 0xfffb) + (ushort)(value == (char *)0x0) * 4;
    }
    *(short *)(piVar2 + 1) = sVar3;
  }
  return 0;
}

Assistant:

static int
archive_filter_lz4_options(struct archive_write_filter *f,
    const char *key, const char *value)
{
	struct private_data *data = (struct private_data *)f->data;

	if (strcmp(key, "compression-level") == 0) {
		int val;
		if (value == NULL || !((val = value[0] - '0') >= 1 && val <= 9) ||
		    value[1] != '\0')
			return (ARCHIVE_WARN);

#ifndef HAVE_LZ4HC_H
		if(val >= 3)
		{
			archive_set_error(f->archive, ARCHIVE_ERRNO_PROGRAMMER,
				"High compression not included in this build");
			return (ARCHIVE_FATAL);
		}
#endif
		data->compression_level = val;
		return (ARCHIVE_OK);
	}
	if (strcmp(key, "stream-checksum") == 0) {
		data->stream_checksum = value != NULL;
		return (ARCHIVE_OK);
	}
	if (strcmp(key, "block-checksum") == 0) {
		data->block_checksum = value != NULL;
		return (ARCHIVE_OK);
	}
	if (strcmp(key, "block-size") == 0) {
		if (value == NULL || !(value[0] >= '4' && value[0] <= '7') ||
		    value[1] != '\0')
			return (ARCHIVE_WARN);
		data->block_maximum_size = value[0] - '0';
		return (ARCHIVE_OK);
	}
	if (strcmp(key, "block-dependence") == 0) {
		data->block_independence = value == NULL;
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}